

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O0

iterator __thiscall
OpenMD::SectionParserManager::findSectionParser(SectionParserManager *this,string *sectionName)

{
  bool bVar1;
  __type_conflict _Var2;
  pointer pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  iterator i;
  list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _List_node_base *local_20;
  _List_iterator<OpenMD::SectionParserContext> local_8;
  
  std::_List_iterator<OpenMD::SectionParserContext>::_List_iterator(&local_8);
  local_20 = (_List_node_base *)
             std::__cxx11::
             list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::
             begin(in_stack_ffffffffffffffc8);
  local_8._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::end
                   (in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_8,&local_28);
    if (!bVar1) {
      return (iterator)local_8._M_node;
    }
    pSVar3 = std::_List_iterator<OpenMD::SectionParserContext>::operator->
                       ((_List_iterator<OpenMD::SectionParserContext> *)0x24c791);
    SectionParser::getSectionName_abi_cxx11_(pSVar3->sectionParser);
    _Var2 = std::operator==(in_RDI,in_RSI);
    if (_Var2) break;
    std::_List_iterator<OpenMD::SectionParserContext>::operator++(&local_8);
  }
  return (iterator)local_8._M_node;
}

Assistant:

SectionParserManager::iterator SectionParserManager::findSectionParser(
      const std::string& sectionName) {
    SectionParserManager::iterator i;
    for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
      if (i->sectionParser->getSectionName() == sectionName) { break; }
    }
    return i;
  }